

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

double expected_avg_depth<double>(double approx_sample_size)

{
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double temp;
  double in_stack_00000068;
  undefined8 local_8;
  
  if (1.0 < in_XMM0_Qa) {
    if (2147483647.0 <= in_XMM0_Qa) {
      dVar1 = 1.0 / (in_XMM0_Qa * in_XMM0_Qa);
      dVar2 = log(in_XMM0_Qa);
      local_8 = -dVar1 * (-dVar1 * (dVar1 * -0.007936507936507936 + 0.016666666666666666) +
                         0.16666666666666666) +
                dVar2 + dVar2 + -0.8455686701969343 + 1.0 / in_XMM0_Qa;
    }
    else {
      dVar1 = digamma(in_stack_00000068);
      local_8 = ((dVar1 + 0.5772156649015329) - 1.0) * 2.0;
    }
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

double expected_avg_depth(ldouble_safe approx_sample_size)
{
    if (approx_sample_size <= 1)
        return 0;
    else if (approx_sample_size < (ldouble_safe)INT32_MAX)
        return 2. * (digamma(approx_sample_size + 1.) + EULERS_GAMMA - 1.);
    else {
        ldouble_safe temp = (ldouble_safe)1 / square(approx_sample_size);
        return (ldouble_safe)2 * std::log(approx_sample_size) + (ldouble_safe)2*((ldouble_safe)EULERS_GAMMA - (ldouble_safe)1)
               + ((ldouble_safe)1/approx_sample_size)
               - temp * ( (ldouble_safe)1/(ldouble_safe)6 -   temp * ((ldouble_safe)1/(ldouble_safe)60 - ((ldouble_safe)1/(ldouble_safe)126)*temp) );
    }
}